

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall TestNoSuchTest::Run(TestNoSuchTest *this)

{
  bool bVar1;
  RunParams local_14c8;
  allocator local_1499;
  string local_1498 [32];
  undefined1 local_1478 [8];
  Results rs;
  TestRegistry r;
  TestNoSuchTest *this_local;
  
  testinator::TestRegistry::TestRegistry
            ((TestRegistry *)
             &rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1498,"A",&local_1499);
  local_14c8.m_flags = 0;
  local_14c8._4_4_ = 0;
  local_14c8.m_numPropertyChecks = 0;
  local_14c8.m_randomSeed = 0;
  testinator::RunParams::RunParams(&local_14c8);
  testinator::TestRegistry::RunTest
            ((Results *)local_1478,
             (TestRegistry *)
             &rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,(string *)local_1498,&local_14c8,
             (Outputter *)0x0);
  std::__cxx11::string::~string(local_1498);
  std::allocator<char>::~allocator((allocator<char> *)&local_1499);
  bVar1 = std::vector<testinator::Result,_std::allocator<testinator::Result>_>::empty
                    ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_1478);
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
            ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_1478);
  testinator::TestRegistry::~TestRegistry
            ((TestRegistry *)
             &rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  return bVar1;
}

Assistant:

virtual bool Run()
  {
    testinator::TestRegistry r;
    testinator::Results rs = r.RunTest("A");
    return rs.empty();
  }